

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGB555,cBGRA,bOverwrite>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  undefined2 uVar1;
  ushort uVar2;
  int iVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004e252d_caseD_0:
    uVar9 = 0;
    uVar11 = (ulong)(uint)count;
    if (count < 1) {
      uVar11 = uVar9;
    }
    for (; (int)uVar11 != (int)uVar9; uVar9 = uVar9 + 1) {
      pout[uVar9 * 4 + 2] = (char)*(ushort *)pin << 3;
      pout[uVar9 * 4 + 1] = (byte)(*(ushort *)pin >> 2) & 0xf8;
      pout[uVar9 * 4] = (byte)(*(ushort *)pin >> 7) & 0xf8;
      pout[uVar9 * 4 + 3] = 0xff;
      pin = (BYTE *)((long)pin + (long)step);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004e252d_caseD_0;
    case BLEND_ICEMAP:
      lVar10 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
        iVar12 = cRGB555::Gray(pin);
        pout[lVar10 * 4 + 2] = IcePalette[iVar12 >> 4][0];
        *(ushort *)(pout + lVar10 * 4) =
             *(ushort *)(IcePalette[iVar12 >> 4] + 1) << 8 |
             *(ushort *)(IcePalette[iVar12 >> 4] + 1) >> 8;
        pout[lVar10 * 4 + 3] = 0xff;
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar10 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
        uVar2 = *(ushort *)pin;
        iVar12 = inf->blendcolor[3];
        iVar7 = inf->blendcolor[1];
        iVar3 = inf->blendcolor[2];
        pout[lVar10 * 4 + 2] =
             (BYTE)(((uint)uVar2 * 8 & 0xff) * iVar12 + inf->blendcolor[0] >> 0x10);
        pout[lVar10 * 4 + 1] = (BYTE)((uVar2 >> 2 & 0xf8) * iVar12 + iVar7 >> 0x10);
        pout[lVar10 * 4] = (BYTE)((uVar2 >> 7 & 0xf8) * iVar12 + iVar3 >> 0x10);
        pout[lVar10 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
      }
      break;
    case BLEND_MODULATE:
      lVar10 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
        uVar2 = *(ushort *)pin;
        iVar12 = inf->blendcolor[1];
        iVar7 = inf->blendcolor[2];
        pout[lVar10 * 4 + 2] = (BYTE)(((uint)uVar2 * 8 & 0xff) * inf->blendcolor[0] >> 0x10);
        pout[lVar10 * 4 + 1] = (BYTE)((uVar2 >> 2 & 0xf8) * iVar12 >> 0x10);
        pout[lVar10 * 4] = (BYTE)((uVar2 >> 7 & 0xf8) * iVar7 >> 0x10);
        pout[lVar10 * 4 + 3] = 0xff;
        pin = (BYTE *)((long)pin + (long)step);
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar10 = (long)EVar4;
      if (lVar10 < 0x21) {
        if (BLEND_ICEMAP < EVar4) {
          iVar12 = 0x20 - EVar4;
          lVar10 = 0;
          if (count < 1) {
            count = 0;
          }
          for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
            iVar7 = cRGB555::Gray(pin);
            uVar2 = *(ushort *)pin;
            iVar7 = iVar7 * (EVar4 + BLEND_MODULATE);
            pout[lVar10 * 4 + 2] = (BYTE)((int)(((uint)uVar2 * 8 & 0xff) * iVar12 + iVar7) / 0x1f);
            pout[lVar10 * 4 + 1] = (BYTE)((int)((uVar2 >> 2 & 0xf8) * iVar12 + iVar7) / 0x1f);
            pout[lVar10 * 4] = (BYTE)((int)((uVar2 >> 7 & 0xf8) * iVar12 + iVar7) / 0x1f);
            pout[lVar10 * 4 + 3] = 0xff;
            pin = (BYTE *)((long)pin + (long)step);
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar13 = 0; count != (int)lVar13; lVar13 = lVar13 + 1) {
          uVar6 = cRGB555::Gray(pin);
          uVar8 = 0xff;
          if (uVar6 < 0xff) {
            uVar8 = uVar6;
          }
          if ((int)uVar6 < 1) {
            uVar8 = 0;
          }
          uVar1 = *(undefined2 *)((long)pFVar5 + (ulong)uVar8 * 4 + lVar10 * 0x518 + -0xa700);
          pout[lVar13 * 4 + 2] =
               *(BYTE *)((long)pFVar5 + (ulong)uVar8 * 4 + lVar10 * 0x518 + -0xa6fe);
          *(undefined2 *)(pout + lVar13 * 4) = uVar1;
          pout[lVar13 * 4 + 3] = 0xff;
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}